

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_loadCEntropy(ZSTD_compressedBlockState_t *bs,void *workspace,void *dict,size_t dictSize)

{
  U32 *pUVar1;
  uint uVar2;
  FSE_repeat FVar3;
  size_t sVar4;
  size_t sVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  size_t sVar9;
  U32 *headerBuffer;
  U32 *pUVar10;
  ulong uVar11;
  bool bVar12;
  uint matchlengthMaxValue;
  uint matchlengthLog;
  uint offcodeMaxValue;
  uint maxSymbolValue;
  short offcodeNCount [32];
  uint local_fc;
  uint local_f8;
  uint local_f4;
  void *local_f0;
  uint local_e8 [28];
  uint local_78 [18];
  
  local_f4 = 0x1f;
  (bs->entropy).huf.repeatMode = HUF_repeat_check;
  local_e8[0] = 0xff;
  local_78[0] = 1;
  sVar4 = HUF_readCTable((HUF_CElt *)bs,local_e8,(void *)((long)dict + 8),dictSize - 8,local_78);
  if (local_78[0] == 0) {
    (bs->entropy).huf.repeatMode = HUF_repeat_valid;
  }
  sVar5 = 0;
  if (local_e8[0] >= 0xff && 0xffffffffffffff88 >= sVar4) {
    sVar5 = sVar4;
  }
  sVar9 = 0xffffffffffffffe2;
  if (local_e8[0] < 0xff || 0xffffffffffffff88 < sVar4) {
    return 0xffffffffffffffe2;
  }
  pUVar10 = (U32 *)(dictSize + (long)dict);
  headerBuffer = (U32 *)((long)dict + 8 + sVar5);
  local_f0 = workspace;
  sVar4 = FSE_readNCount((short *)local_78,&local_f4,local_e8,headerBuffer,
                         (long)pUVar10 - (long)headerBuffer);
  if ((sVar4 < 0xffffffffffffff89) && (local_e8[0] < 9)) {
    sVar5 = FSE_buildCTable_wksp
                      ((bs->entropy).fse.offcodeCTable,(short *)local_78,0x1f,local_e8[0],local_f0,
                       0x1900);
    bVar12 = sVar5 < 0xffffffffffffff89;
    sVar5 = 0;
    if (bVar12) {
      sVar5 = sVar4;
    }
    headerBuffer = (U32 *)((long)headerBuffer + sVar5);
  }
  else {
    bVar12 = false;
  }
  if (!bVar12) {
    return 0xffffffffffffffe2;
  }
  local_fc = 0x34;
  sVar4 = FSE_readNCount((short *)local_e8,&local_fc,&local_f8,headerBuffer,
                         (long)pUVar10 - (long)headerBuffer);
  if (((sVar4 < 0xffffffffffffff89) && (local_f8 < 10)) &&
     (sVar5 = FSE_buildCTable_wksp
                        ((bs->entropy).fse.matchlengthCTable,(short *)local_e8,local_fc,local_f8,
                         local_f0,0x1900), sVar5 < 0xffffffffffffff89)) {
    FVar3 = FSE_repeat_check;
    if (0x33 < local_fc) {
      lVar6 = 0;
      do {
        if (*(short *)((long)local_e8 + lVar6 * 2) == 0) goto LAB_005d3e5f;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x35);
      FVar3 = FSE_repeat_valid;
    }
LAB_005d3e5f:
    (bs->entropy).fse.matchlength_repeatMode = FVar3;
    headerBuffer = (U32 *)((long)headerBuffer + sVar4);
    bVar12 = true;
  }
  else {
    bVar12 = false;
  }
  if (!bVar12) {
    return 0xffffffffffffffe2;
  }
  local_fc = 0x23;
  sVar4 = FSE_readNCount((short *)local_e8,&local_fc,&local_f8,headerBuffer,
                         (long)pUVar10 - (long)headerBuffer);
  if (((sVar4 < 0xffffffffffffff89) && (local_f8 < 10)) &&
     (sVar5 = FSE_buildCTable_wksp
                        ((bs->entropy).fse.litlengthCTable,(short *)local_e8,local_fc,local_f8,
                         local_f0,0x1900), sVar5 < 0xffffffffffffff89)) {
    FVar3 = FSE_repeat_check;
    if (0x22 < local_fc) {
      lVar6 = 0;
      do {
        if (*(short *)((long)local_e8 + lVar6 * 2) == 0) goto LAB_005d3ef6;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x24);
      FVar3 = FSE_repeat_valid;
    }
LAB_005d3ef6:
    (bs->entropy).fse.litlength_repeatMode = FVar3;
    headerBuffer = (U32 *)((long)headerBuffer + sVar4);
    bVar12 = true;
  }
  else {
    bVar12 = false;
  }
  if ((bVar12) && (pUVar1 = headerBuffer + 3, pUVar1 <= pUVar10)) {
    bs->rep[0] = *headerBuffer;
    bs->rep[1] = headerBuffer[1];
    uVar11 = (long)pUVar10 - (long)pUVar1;
    uVar7 = (int)uVar11 + 0x20000;
    uVar2 = 0x1f;
    if (uVar7 != 0) {
      for (; uVar7 >> uVar2 == 0; uVar2 = uVar2 - 1) {
      }
    }
    uVar7 = 0x1f;
    if (uVar11 >> 0x11 < 0x7fff) {
      uVar7 = uVar2;
    }
    bs->rep[2] = headerBuffer[2];
    FVar3 = FSE_repeat_check;
    if (uVar7 <= local_f4) {
      uVar8 = 0;
      do {
        if (*(short *)((long)local_78 + uVar8 * 2) == 0) goto LAB_005d3f86;
        uVar8 = uVar8 + 1;
      } while (uVar7 + 1 != uVar8);
      FVar3 = FSE_repeat_valid;
    }
LAB_005d3f86:
    (bs->entropy).fse.offcode_repeatMode = FVar3;
    lVar6 = 0;
    do {
      if ((ulong)bs->rep[lVar6] == 0) {
        return 0xffffffffffffffe2;
      }
      if (uVar11 < bs->rep[lVar6]) {
        return 0xffffffffffffffe2;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    sVar9 = (long)pUVar1 - (long)dict;
  }
  return sVar9;
}

Assistant:

size_t ZSTD_loadCEntropy(ZSTD_compressedBlockState_t* bs, void* workspace,
                         const void* const dict, size_t dictSize)
{
    short offcodeNCount[MaxOff+1];
    unsigned offcodeMaxValue = MaxOff;
    const BYTE* dictPtr = (const BYTE*)dict;    /* skip magic num and dict ID */
    const BYTE* const dictEnd = dictPtr + dictSize;
    dictPtr += 8;
    bs->entropy.huf.repeatMode = HUF_repeat_check;

    {   unsigned maxSymbolValue = 255;
        unsigned hasZeroWeights = 1;
        size_t const hufHeaderSize = HUF_readCTable((HUF_CElt*)bs->entropy.huf.CTable, &maxSymbolValue, dictPtr,
            dictEnd-dictPtr, &hasZeroWeights);

        /* We only set the loaded table as valid if it contains all non-zero
         * weights. Otherwise, we set it to check */
        if (!hasZeroWeights)
            bs->entropy.huf.repeatMode = HUF_repeat_valid;

        RETURN_ERROR_IF(HUF_isError(hufHeaderSize), dictionary_corrupted, "");
        RETURN_ERROR_IF(maxSymbolValue < 255, dictionary_corrupted, "");
        dictPtr += hufHeaderSize;
    }

    {   unsigned offcodeLog;
        size_t const offcodeHeaderSize = FSE_readNCount(offcodeNCount, &offcodeMaxValue, &offcodeLog, dictPtr, dictEnd-dictPtr);
        RETURN_ERROR_IF(FSE_isError(offcodeHeaderSize), dictionary_corrupted, "");
        RETURN_ERROR_IF(offcodeLog > OffFSELog, dictionary_corrupted, "");
        /* fill all offset symbols to avoid garbage at end of table */
        RETURN_ERROR_IF(FSE_isError(FSE_buildCTable_wksp(
                bs->entropy.fse.offcodeCTable,
                offcodeNCount, MaxOff, offcodeLog,
                workspace, HUF_WORKSPACE_SIZE)),
            dictionary_corrupted, "");
        /* Defer checking offcodeMaxValue because we need to know the size of the dictionary content */
        dictPtr += offcodeHeaderSize;
    }

    {   short matchlengthNCount[MaxML+1];
        unsigned matchlengthMaxValue = MaxML, matchlengthLog;
        size_t const matchlengthHeaderSize = FSE_readNCount(matchlengthNCount, &matchlengthMaxValue, &matchlengthLog, dictPtr, dictEnd-dictPtr);
        RETURN_ERROR_IF(FSE_isError(matchlengthHeaderSize), dictionary_corrupted, "");
        RETURN_ERROR_IF(matchlengthLog > MLFSELog, dictionary_corrupted, "");
        RETURN_ERROR_IF(FSE_isError(FSE_buildCTable_wksp(
                bs->entropy.fse.matchlengthCTable,
                matchlengthNCount, matchlengthMaxValue, matchlengthLog,
                workspace, HUF_WORKSPACE_SIZE)),
            dictionary_corrupted, "");
        bs->entropy.fse.matchlength_repeatMode = ZSTD_dictNCountRepeat(matchlengthNCount, matchlengthMaxValue, MaxML);
        dictPtr += matchlengthHeaderSize;
    }

    {   short litlengthNCount[MaxLL+1];
        unsigned litlengthMaxValue = MaxLL, litlengthLog;
        size_t const litlengthHeaderSize = FSE_readNCount(litlengthNCount, &litlengthMaxValue, &litlengthLog, dictPtr, dictEnd-dictPtr);
        RETURN_ERROR_IF(FSE_isError(litlengthHeaderSize), dictionary_corrupted, "");
        RETURN_ERROR_IF(litlengthLog > LLFSELog, dictionary_corrupted, "");
        RETURN_ERROR_IF(FSE_isError(FSE_buildCTable_wksp(
                bs->entropy.fse.litlengthCTable,
                litlengthNCount, litlengthMaxValue, litlengthLog,
                workspace, HUF_WORKSPACE_SIZE)),
            dictionary_corrupted, "");
        bs->entropy.fse.litlength_repeatMode = ZSTD_dictNCountRepeat(litlengthNCount, litlengthMaxValue, MaxLL);
        dictPtr += litlengthHeaderSize;
    }

    RETURN_ERROR_IF(dictPtr+12 > dictEnd, dictionary_corrupted, "");
    bs->rep[0] = MEM_readLE32(dictPtr+0);
    bs->rep[1] = MEM_readLE32(dictPtr+4);
    bs->rep[2] = MEM_readLE32(dictPtr+8);
    dictPtr += 12;

    {   size_t const dictContentSize = (size_t)(dictEnd - dictPtr);
        U32 offcodeMax = MaxOff;
        if (dictContentSize <= ((U32)-1) - 128 KB) {
            U32 const maxOffset = (U32)dictContentSize + 128 KB; /* The maximum offset that must be supported */
            offcodeMax = ZSTD_highbit32(maxOffset); /* Calculate minimum offset code required to represent maxOffset */
        }
        /* All offset values <= dictContentSize + 128 KB must be representable for a valid table */
        bs->entropy.fse.offcode_repeatMode = ZSTD_dictNCountRepeat(offcodeNCount, offcodeMaxValue, MIN(offcodeMax, MaxOff));

        /* All repCodes must be <= dictContentSize and != 0 */
        {   U32 u;
            for (u=0; u<3; u++) {
                RETURN_ERROR_IF(bs->rep[u] == 0, dictionary_corrupted, "");
                RETURN_ERROR_IF(bs->rep[u] > dictContentSize, dictionary_corrupted, "");
    }   }   }

    return dictPtr - (const BYTE*)dict;
}